

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

int gdLayerOverlay(int dst,int src)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int a2;
  int a1;
  int src_local;
  int dst_local;
  
  iVar1 = gdAlphaOverlayColor((int)(src & 0xff0000U) >> 0x10,(int)(dst & 0xff0000U) >> 0x10,0xff);
  iVar2 = gdAlphaOverlayColor((int)(src & 0xff00U) >> 8,(int)(dst & 0xff00U) >> 8,0xff);
  iVar3 = gdAlphaOverlayColor(src & 0xff,dst & 0xff,0xff);
  return (0x7f - ((0x7f - ((int)(dst & 0x7f000000U) >> 0x18)) *
                 (0x7f - ((int)(src & 0x7f000000U) >> 0x18))) / 0x7f) * 0x1000000 + iVar1 * 0x10000
         + iVar2 * 0x100 + iVar3;
}

Assistant:

BGD_DECLARE(int) gdLayerOverlay (int dst, int src)
{
	int a1, a2;
	a1 = gdAlphaMax - gdTrueColorGetAlpha(dst);
	a2 = gdAlphaMax - gdTrueColorGetAlpha(src);
	return ( ((gdAlphaMax - a1*a2/gdAlphaMax) << 24) +
		(gdAlphaOverlayColor( gdTrueColorGetRed(src), gdTrueColorGetRed(dst), gdRedMax ) << 16) +
		(gdAlphaOverlayColor( gdTrueColorGetGreen(src), gdTrueColorGetGreen(dst), gdGreenMax ) << 8) +
		(gdAlphaOverlayColor( gdTrueColorGetBlue(src), gdTrueColorGetBlue(dst), gdBlueMax ))
		);
}